

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  Expression *pEVar1;
  Expression *args_1;
  MultipleConcatenationExpressionSyntax *pMVar2;
  bool bVar3;
  bitwidth_t bVar4;
  ExpressionSyntax *syntax_00;
  ConcatenationExpressionSyntax *pCVar5;
  Type *pTVar6;
  Compilation *pCVar7;
  Diagnostic *pDVar8;
  int *piVar9;
  ConstantValue **this;
  uint *puVar10;
  bitmask<slang::ast::IntegralFlags> local_3f1;
  Type *local_3f0;
  Type *local_3e8;
  SourceRange local_3e0;
  SVInt local_3d0;
  SVInt local_3c0;
  SVInt local_3b0;
  _Optional_payload_base<unsigned_int> local_3a0;
  optional<unsigned_int> width;
  Type *local_390;
  Type *local_388;
  Type *local_380;
  SourceLocation local_378;
  SourceLocation SStack_370;
  undefined4 local_364;
  underlying_type_t<slang::ast::ASTFlags> local_360;
  bitmask<slang::ast::ASTFlags> local_358;
  bitmask<slang::ast::ASTFlags> local_350;
  SourceLocation local_348;
  SourceLocation SStack_340;
  _Optional_payload_base<int> local_330;
  _Optional_payload_base<int> local_328;
  optional<int> count;
  Type *local_318;
  SourceLocation local_310;
  int local_308;
  undefined1 local_2f8 [8];
  ConstantValue leftVal;
  undefined1 local_2c8 [8];
  EvalContext evalCtx;
  Token local_88;
  SourceLocation local_78;
  DiagCode local_6c;
  Diagnostic *local_68;
  Diagnostic *diag;
  Compilation *local_50;
  ReplicationExpression *result;
  Expression *local_40;
  Expression *right;
  Expression *local_30;
  Expression *left;
  ASTContext *context_local;
  MultipleConcatenationExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  left = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (MultipleConcatenationExpressionSyntax *)compilation;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expression);
  pEVar1 = left;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&right,None);
  local_30 = Expression::selfDetermined
                       (compilation,syntax_00,(ASTContext *)pEVar1,
                        (bitmask<slang::ast::ASTFlags>)right);
  pMVar2 = syntax_local;
  pCVar5 = not_null<slang::syntax::ConcatenationExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ConcatenationExpressionSyntax_*> *)
                      &context_local->randomizeDetails);
  pEVar1 = left;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  local_40 = Expression::create((Compilation *)pMVar2,(ExpressionSyntax *)pCVar5,
                                (ASTContext *)pEVar1,(bitmask<slang::ast::ASTFlags>)result,
                                (Type *)0x0);
  pMVar2 = syntax_local;
  pTVar6 = Compilation::getErrorType((Compilation *)syntax_local);
  args_1 = local_30;
  pEVar1 = local_40;
  _diag = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_50 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)pMVar2,pTVar6,args_1,pEVar1,(SourceRange *)&diag);
  bVar3 = Expression::bad(local_30);
  if ((bVar3) || (bVar3 = Expression::bad(local_40), bVar3)) {
    pCVar7 = (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
    return (Expression *)pCVar7;
  }
  pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_30->type);
  bVar3 = Type::isIntegral(pTVar6);
  if (bVar3) {
    pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_40->type);
    bVar3 = Type::isIntegral(pTVar6);
    if (!bVar3) {
      pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_40->type);
      bVar3 = Type::isString(pTVar6);
      if (!bVar3) goto LAB_00690fc6;
    }
    pMVar2 = syntax_local;
    bitmask<slang::ast::EvalFlags>::bitmask
              ((bitmask<slang::ast::EvalFlags> *)
               ((long)&leftVal.value.
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + 0x27),CacheResults);
    EvalContext::EvalContext
              ((EvalContext *)local_2c8,(Compilation *)pMVar2,
               (bitmask<slang::ast::EvalFlags>)
               leftVal.value.
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               ._39_1_);
    Expression::eval((ConstantValue *)local_2f8,local_30,(EvalContext *)local_2c8);
    bVar3 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)local_2f8);
    if (bVar3) {
      local_308 = 0;
    }
    else {
      bVar3 = Expression::isImplicitString(local_40);
      pEVar1 = left;
      if (bVar3) {
        pTVar6 = Compilation::getStringType((Compilation *)syntax_local);
        SourceLocation::SourceLocation(&local_310);
        Expression::contextDetermined((ASTContext *)pEVar1,&local_40,pTVar6,local_310);
        *(Expression **)&(local_50->options).allowHierarchicalConst = local_40;
        count.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)
             Compilation::getStringType((Compilation *)syntax_local);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_318,(Type **)&count);
        (((Expression *)&local_50->super_BumpAllocator)->type).ptr = local_318;
        compilation_local = local_50;
        local_308 = 1;
      }
      else {
        EvalContext::reportDiags((EvalContext *)local_2c8,(ASTContext *)left);
        compilation_local =
             (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
        local_308 = 1;
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)local_2f8);
    if (local_308 == 0) {
      local_328 = (_Optional_payload_base<int>)ASTContext::evalInteger((ASTContext *)left,local_30);
      bVar3 = std::optional::operator_cast_to_bool((optional *)&local_328);
      if (bVar3) {
        piVar9 = std::optional<int>::operator*((optional<int> *)&local_328);
        if (*piVar9 < 0) {
          local_330 = local_328;
          local_348 = (local_30->sourceRange).startLoc;
          SStack_340 = (local_30->sourceRange).endLoc;
          ASTContext::requireGtZero
                    ((ASTContext *)left,(optional<int>)local_328,local_30->sourceRange);
          compilation_local =
               (Compilation *)
               Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
          local_308 = 1;
        }
        else {
          piVar9 = std::optional<int>::operator*((optional<int> *)&local_328);
          if (*piVar9 == 0) {
            this = &left->constant;
            bitmask<slang::ast::ASTFlags>::bitmask(&local_358,InsideConcatenation);
            local_350 = bitmask<slang::ast::ASTFlags>::operator&
                                  ((bitmask<slang::ast::ASTFlags> *)this,&local_358);
            local_360 = 0;
            bVar3 = slang::operator==(&local_350,&local_360);
            if (bVar3) {
              local_364 = 0x820007;
              local_378 = (local_30->sourceRange).startLoc;
              SStack_370 = (local_30->sourceRange).endLoc;
              ASTContext::addDiag((ASTContext *)left,(DiagCode)0x820007,local_30->sourceRange);
              compilation_local =
                   (Compilation *)
                   Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
              local_308 = 1;
            }
            else {
              local_388 = Compilation::getVoidType((Compilation *)syntax_local);
              not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                        ((not_null<slang::ast::Type_const*> *)&local_380,&local_388);
              (((Expression *)&local_50->super_BumpAllocator)->type).ptr = local_380;
              compilation_local = local_50;
              local_308 = 1;
            }
          }
          else {
            Expression::selfDetermined((ASTContext *)left,&local_40);
            *(Expression **)&(local_50->options).allowHierarchicalConst = local_40;
            pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_40->type);
            bVar3 = Type::isString(pTVar6);
            pEVar1 = left;
            if (bVar3) {
              width.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> =
                   (_Optional_base<unsigned_int,_true,_true>)
                   Compilation::getStringType((Compilation *)syntax_local);
              not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                        ((not_null<slang::ast::Type_const*> *)&local_390,(Type **)&width);
              (((Expression *)&local_50->super_BumpAllocator)->type).ptr = local_390;
              compilation_local = local_50;
              local_308 = 1;
            }
            else {
              piVar9 = std::optional<int>::operator*((optional<int> *)&local_328);
              SVInt::SVInt(&local_3c0,0x20,(long)*piVar9,true);
              pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_40->type);
              bVar4 = Type::getBitWidth(pTVar6);
              SVInt::SVInt<unsigned_int,void>(&local_3d0,bVar4);
              SVInt::operator*(&local_3b0,&local_3c0);
              local_3e0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
              local_3a0 = (_Optional_payload_base<unsigned_int>)
                          ASTContext::requireValidBitWidth
                                    ((ASTContext *)pEVar1,&local_3b0,local_3e0);
              SVInt::~SVInt(&local_3b0);
              SVInt::~SVInt(&local_3d0);
              SVInt::~SVInt(&local_3c0);
              bVar3 = std::optional::operator_cast_to_bool((optional *)&local_3a0);
              pMVar2 = syntax_local;
              if (bVar3) {
                puVar10 = std::optional<unsigned_int>::operator*
                                    ((optional<unsigned_int> *)&local_3a0);
                bVar4 = *puVar10;
                pTVar6 = not_null<const_slang::ast::Type_*>::operator->(&local_40->type);
                bVar3 = Type::isFourState(pTVar6);
                bitmask<slang::ast::IntegralFlags>::bitmask(&local_3f1,bVar3 * '\x02');
                local_3f0 = Compilation::getType((Compilation *)pMVar2,bVar4,local_3f1);
                not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                          ((not_null<slang::ast::Type_const*> *)&local_3e8,&local_3f0);
                (((Expression *)&local_50->super_BumpAllocator)->type).ptr = local_3e8;
                compilation_local = local_50;
                local_308 = 1;
              }
              else {
                compilation_local =
                     (Compilation *)
                     Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
                local_308 = 1;
              }
            }
          }
        }
      }
      else {
        compilation_local =
             (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
        local_308 = 1;
      }
    }
    EvalContext::~EvalContext((EvalContext *)local_2c8);
  }
  else {
LAB_00690fc6:
    pEVar1 = left;
    local_6c.subsystem = Expressions;
    local_6c.code = 0x25;
    pCVar5 = not_null<slang::syntax::ConcatenationExpressionSyntax_*>::operator->
                       ((not_null<slang::syntax::ConcatenationExpressionSyntax_*> *)
                        &context_local->randomizeDetails);
    local_88 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)pCVar5);
    local_78 = parsing::Token::location(&local_88);
    pDVar8 = ASTContext::addDiag((ASTContext *)pEVar1,local_6c,local_78);
    local_68 = pDVar8;
    pTVar6 = not_null<const_slang::ast::Type_*>::operator*(&local_30->type);
    pDVar8 = ast::operator<<(pDVar8,pTVar6);
    pTVar6 = not_null<const_slang::ast::Type_*>::operator*(&local_40->type);
    ast::operator<<(pDVar8,pTVar6);
    Diagnostic::operator<<(local_68,local_30->sourceRange);
    evalCtx.disableRange.endLoc = (local_40->sourceRange).startLoc;
    Diagnostic::operator<<(local_68,local_40->sourceRange);
    compilation_local =
         (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_50);
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(compilation, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportDiags(context);
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, compilation.getStringType());

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if ((context.flags & ASTFlags::InsideConcatenation) == 0) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}